

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O1

AggregateFunction *
duckdb::EmptyQuantileFunction<duckdb::DiscreteQuantileListFunction>
          (AggregateFunction *__return_storage_ptr__,LogicalType *input,LogicalType *result,
          LogicalType *extra_arg)

{
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_51;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_50;
  LogicalType local_38;
  
  LogicalType::LogicalType(&local_38,input);
  __l._M_len = 1;
  __l._M_array = &local_38;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_50,__l,&local_51);
  AggregateFunction::AggregateFunction
            (__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_50,result,
             (aggregate_size_t)0x0,(aggregate_initialize_t)0x0,(aggregate_update_t)0x0,
             (aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,
             DiscreteQuantileListFunction::Bind,(aggregate_destructor_t)0x0,
             (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_50);
  LogicalType::~LogicalType(&local_38);
  if (extra_arg->id_ != INVALID) {
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              (&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,extra_arg);
  }
  __return_storage_ptr__->serialize = QuantileBindData::Serialize;
  __return_storage_ptr__->deserialize = DiscreteQuantileListFunction::Deserialize;
  __return_storage_ptr__->order_dependent = NOT_ORDER_DEPENDENT;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction EmptyQuantileFunction(LogicalType input, LogicalType result, const LogicalType &extra_arg) {
	AggregateFunction fun({std::move(input)}, std::move(result), nullptr, nullptr, nullptr, nullptr, nullptr, nullptr,
	                      OP::Bind);
	if (extra_arg.id() != LogicalTypeId::INVALID) {
		fun.arguments.push_back(extra_arg);
	}
	fun.serialize = QuantileBindData::Serialize;
	fun.deserialize = OP::Deserialize;
	fun.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
	return fun;
}